

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O2

void * SeanetThread(void *pParam)

{
  ulong uVar1;
  timeval *ptVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  double *pdVar6;
  char *pcVar7;
  tm *ptVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  int local_1184;
  uint local_1180;
  uint local_117c;
  timeval *local_1178;
  int local_1170;
  int local_116c;
  double local_1168;
  char SOf [4];
  timeval local_1158;
  time_t tt;
  double distance;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  ulong local_1118;
  ulong local_1110;
  ulong local_1108;
  ulong local_1100;
  uchar auxbuf [128];
  SEANET seanet;
  CHRONO chrono_period;
  char szTemp [256];
  char szSaveFilePath [256];
  uchar scanline [2048];
  
  distance = 0.0;
  memset(&seanet,0,0x5f0);
  local_1158.tv_sec = 0;
  local_1158.tv_usec = 0;
  local_1168 = 0.0;
  memset(scanline,0,0x800);
  auxbuf[0] = '\0';
  auxbuf[1] = '\0';
  auxbuf[2] = '\0';
  auxbuf[3] = '\0';
  auxbuf[4] = '\0';
  auxbuf[5] = '\0';
  auxbuf[6] = '\0';
  auxbuf[7] = '\0';
  auxbuf[8] = '\0';
  auxbuf[9] = '\0';
  auxbuf[10] = '\0';
  auxbuf[0xb] = '\0';
  auxbuf[0xc] = '\0';
  auxbuf[0xd] = '\0';
  auxbuf[0xe] = '\0';
  auxbuf[0xf] = '\0';
  auxbuf[0x10] = '\0';
  auxbuf[0x11] = '\0';
  auxbuf[0x12] = '\0';
  auxbuf[0x13] = '\0';
  auxbuf[0x14] = '\0';
  auxbuf[0x15] = '\0';
  auxbuf[0x16] = '\0';
  auxbuf[0x17] = '\0';
  auxbuf[0x18] = '\0';
  auxbuf[0x19] = '\0';
  auxbuf[0x1a] = '\0';
  auxbuf[0x1b] = '\0';
  auxbuf[0x1c] = '\0';
  auxbuf[0x1d] = '\0';
  auxbuf[0x1e] = '\0';
  auxbuf[0x1f] = '\0';
  auxbuf[0x20] = '\0';
  auxbuf[0x21] = '\0';
  auxbuf[0x22] = '\0';
  auxbuf[0x23] = '\0';
  auxbuf[0x24] = '\0';
  auxbuf[0x25] = '\0';
  auxbuf[0x26] = '\0';
  auxbuf[0x27] = '\0';
  auxbuf[0x28] = '\0';
  auxbuf[0x29] = '\0';
  auxbuf[0x2a] = '\0';
  auxbuf[0x2b] = '\0';
  auxbuf[0x2c] = '\0';
  auxbuf[0x2d] = '\0';
  auxbuf[0x2e] = '\0';
  auxbuf[0x2f] = '\0';
  auxbuf[0x30] = '\0';
  auxbuf[0x31] = '\0';
  auxbuf[0x32] = '\0';
  auxbuf[0x33] = '\0';
  auxbuf[0x34] = '\0';
  auxbuf[0x35] = '\0';
  auxbuf[0x36] = '\0';
  auxbuf[0x37] = '\0';
  auxbuf[0x38] = '\0';
  auxbuf[0x39] = '\0';
  auxbuf[0x3a] = '\0';
  auxbuf[0x3b] = '\0';
  auxbuf[0x3c] = '\0';
  auxbuf[0x3d] = '\0';
  auxbuf[0x3e] = '\0';
  auxbuf[0x3f] = '\0';
  auxbuf[0x40] = '\0';
  auxbuf[0x41] = '\0';
  auxbuf[0x42] = '\0';
  auxbuf[0x43] = '\0';
  auxbuf[0x44] = '\0';
  auxbuf[0x45] = '\0';
  auxbuf[0x46] = '\0';
  auxbuf[0x47] = '\0';
  auxbuf[0x48] = '\0';
  auxbuf[0x49] = '\0';
  auxbuf[0x4a] = '\0';
  auxbuf[0x4b] = '\0';
  auxbuf[0x4c] = '\0';
  auxbuf[0x4d] = '\0';
  auxbuf[0x4e] = '\0';
  auxbuf[0x4f] = '\0';
  auxbuf[0x50] = '\0';
  auxbuf[0x51] = '\0';
  auxbuf[0x52] = '\0';
  auxbuf[0x53] = '\0';
  auxbuf[0x54] = '\0';
  auxbuf[0x55] = '\0';
  auxbuf[0x56] = '\0';
  auxbuf[0x57] = '\0';
  auxbuf[0x58] = '\0';
  auxbuf[0x59] = '\0';
  auxbuf[0x5a] = '\0';
  auxbuf[0x5b] = '\0';
  auxbuf[0x5c] = '\0';
  auxbuf[0x5d] = '\0';
  auxbuf[0x5e] = '\0';
  auxbuf[0x5f] = '\0';
  auxbuf[0x60] = '\0';
  auxbuf[0x61] = '\0';
  auxbuf[0x62] = '\0';
  auxbuf[99] = '\0';
  auxbuf[100] = '\0';
  auxbuf[0x65] = '\0';
  auxbuf[0x66] = '\0';
  auxbuf[0x67] = '\0';
  auxbuf[0x68] = '\0';
  auxbuf[0x69] = '\0';
  auxbuf[0x6a] = '\0';
  auxbuf[0x6b] = '\0';
  auxbuf[0x6c] = '\0';
  auxbuf[0x6d] = '\0';
  auxbuf[0x6e] = '\0';
  auxbuf[0x6f] = '\0';
  auxbuf[0x70] = '\0';
  auxbuf[0x71] = '\0';
  auxbuf[0x72] = '\0';
  auxbuf[0x73] = '\0';
  auxbuf[0x74] = '\0';
  auxbuf[0x75] = '\0';
  auxbuf[0x76] = '\0';
  auxbuf[0x77] = '\0';
  auxbuf[0x78] = '\0';
  auxbuf[0x79] = '\0';
  auxbuf[0x7a] = '\0';
  auxbuf[0x7b] = '\0';
  auxbuf[0x7c] = '\0';
  auxbuf[0x7d] = '\0';
  auxbuf[0x7e] = '\0';
  auxbuf[0x7f] = '\0';
  local_1184 = 0;
  StartChrono(&chrono_period);
  local_1170 = 100;
  local_116c = 0;
  bVar3 = false;
  do {
    bVar3 = !bVar3;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      if (bPauseSeanet == 0) break;
      if (!bVar3) {
        puts("Seanet paused.");
        DisconnectSeanetEx(&seanet);
      }
      if (bExit != 0) goto LAB_0017197d;
      mSleep(100);
      bVar3 = true;
    }
    if (bRestartSeanet == 0) {
      if (bVar3) goto LAB_00171218;
      local_1184 = 0;
      iVar5 = GetHeadDataAndAuxDataSeanetEx(&seanet,scanline,&local_1168,auxbuf,&local_1184);
      if (iVar5 != 0) {
        puts("Connection to a Seanet lost.");
        DisconnectSeanetEx(&seanet);
        lVar11 = (long)local_1170;
        goto LAB_0017122d;
      }
      tt = 0;
      iVar5 = gettimeofday(&local_1158,(__timezone_ptr_t)0x0);
      if (iVar5 != 0) {
        local_1158.tv_sec = 0;
        local_1158.tv_usec = 0;
      }
      tt = local_1158.tv_sec;
      ptVar8 = localtime(&tt);
      if (ptVar8 == (tm *)0x0) {
        local_1178 = (timeval *)0x0;
        local_117c = 0;
        local_1180 = 0;
      }
      else {
        local_1180 = ptVar8->tm_min;
        local_117c = ptVar8->tm_hour;
        local_1178 = (timeval *)((double)local_1158.tv_usec * 1e-06 + (double)ptVar8->tm_sec);
      }
      if (0 < local_1184) {
        iVar5 = __isoc99_sscanf(auxbuf,"%lfm\r",&distance);
        if (iVar5 == 1) {
          pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
          altitude_AGL = distance;
          pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        }
        if (seanet.bSaveRawData != 0) {
          fprintf((FILE *)seanet.pfSaveFile,"%02d:%02d:%06.3f,%.100s\n",(int)local_1178,
                  (ulong)local_117c,(ulong)local_1180,auxbuf);
        }
      }
      pthread_mutex_lock((pthread_mutex_t *)&SeanetDataCS);
      ptVar2 = tvs + index_scanlines;
      ptVar2->tv_sec = local_1158.tv_sec;
      ptVar2->tv_usec = local_1158.tv_usec;
      lVar11 = (long)index_scanlines;
      angles[lVar11] = local_1168;
      memcpy(scanlines + lVar11 * seanet.NBins,scanline,(long)seanet.NBins);
      index_scanlines = (index_scanlines + 1) % seanet.NSteps;
      pthread_mutex_unlock((pthread_mutex_t *)&SeanetDataCS);
      if (seanet.bSaveRawData != 0) {
        SOf[0] = 'D';
        SOf[1] = 'I';
        SOf[2] = 'G';
        SOf[3] = '\0';
        if (seanet.bDST == 0) {
          SOf[0] = 'S';
          SOf[1] = 'O';
          SOf[2] = 'N';
          SOf[3] = '\0';
        }
        local_1100 = (ulong)(uint)seanet.HeadStatus;
        local_1108 = (ulong)seanet.HeadHdCtrl.u;
        local_1110 = (ulong)(uint)seanet.HeadRangescale;
        local_1118 = (ulong)(uint)seanet.HeadIGain;
        local_1120 = (ulong)(uint)seanet.HeadSlope;
        local_1128 = (ulong)(uint)seanet.HeadADLow;
        local_1130 = (ulong)(uint)seanet.HeadADSpan;
        fprintf((FILE *)seanet.pfSaveFile,
                "%.3s,%02d:%02d:%06.3f,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d",(int)local_1178,SOf,
                (ulong)local_117c,(ulong)local_1180,2,local_1100,local_1108,local_1110,local_1118,
                local_1120,local_1128,local_1130,(ulong)(uint)seanet.HeadLeftLim,
                (ulong)(uint)seanet.HeadRightLim,(ulong)(uint)seanet.HeadSteps,
                (long)(int)(local_1168 / 0.05625 + 3200.0 + 6400.0) % 0x1900 & 0xffffffff,
                (ulong)(uint)seanet.Dbytes);
        if (seanet.adc8on == 0) {
          for (lVar11 = 0; lVar11 < seanet.Dbytes; lVar11 = lVar11 + 1) {
            fprintf((FILE *)seanet.pfSaveFile,",%d",
                    (ulong)((uint)(scanline[lVar11 * 2 + 1] >> 4) |
                           scanline[lVar11 * 2] & 0xfffffff0));
          }
        }
        else {
          for (lVar11 = 0; lVar11 < seanet.Dbytes; lVar11 = lVar11 + 1) {
            fprintf((FILE *)seanet.pfSaveFile,",%d",(ulong)scanline[lVar11]);
          }
        }
        fputc(10,(FILE *)seanet.pfSaveFile);
        fflush((FILE *)seanet.pfSaveFile);
      }
      bVar4 = false;
      bVar3 = true;
    }
    else {
      if (!bVar3) {
        puts("Restarting a Seanet.");
        DisconnectSeanetEx(&seanet);
      }
      bRestartSeanet = 0;
LAB_00171218:
      iVar5 = ConnectSeanetEx(&seanet,"Seanet0.txt");
      lVar11 = 1000;
      if (iVar5 == 0) {
        local_1170 = seanet.threadperiod;
        local_1158.tv_sec = 0;
        local_1158.tv_usec = 0;
        local_1168 = 0.0;
        memset(scanline,0,0x800);
        auxbuf[0] = '\0';
        auxbuf[1] = '\0';
        auxbuf[2] = '\0';
        auxbuf[3] = '\0';
        auxbuf[4] = '\0';
        auxbuf[5] = '\0';
        auxbuf[6] = '\0';
        auxbuf[7] = '\0';
        auxbuf[8] = '\0';
        auxbuf[9] = '\0';
        auxbuf[10] = '\0';
        auxbuf[0xb] = '\0';
        auxbuf[0xc] = '\0';
        auxbuf[0xd] = '\0';
        auxbuf[0xe] = '\0';
        auxbuf[0xf] = '\0';
        auxbuf[0x10] = '\0';
        auxbuf[0x11] = '\0';
        auxbuf[0x12] = '\0';
        auxbuf[0x13] = '\0';
        auxbuf[0x14] = '\0';
        auxbuf[0x15] = '\0';
        auxbuf[0x16] = '\0';
        auxbuf[0x17] = '\0';
        auxbuf[0x18] = '\0';
        auxbuf[0x19] = '\0';
        auxbuf[0x1a] = '\0';
        auxbuf[0x1b] = '\0';
        auxbuf[0x1c] = '\0';
        auxbuf[0x1d] = '\0';
        auxbuf[0x1e] = '\0';
        auxbuf[0x1f] = '\0';
        auxbuf[0x20] = '\0';
        auxbuf[0x21] = '\0';
        auxbuf[0x22] = '\0';
        auxbuf[0x23] = '\0';
        auxbuf[0x24] = '\0';
        auxbuf[0x25] = '\0';
        auxbuf[0x26] = '\0';
        auxbuf[0x27] = '\0';
        auxbuf[0x28] = '\0';
        auxbuf[0x29] = '\0';
        auxbuf[0x2a] = '\0';
        auxbuf[0x2b] = '\0';
        auxbuf[0x2c] = '\0';
        auxbuf[0x2d] = '\0';
        auxbuf[0x2e] = '\0';
        auxbuf[0x2f] = '\0';
        auxbuf[0x30] = '\0';
        auxbuf[0x31] = '\0';
        auxbuf[0x32] = '\0';
        auxbuf[0x33] = '\0';
        auxbuf[0x34] = '\0';
        auxbuf[0x35] = '\0';
        auxbuf[0x36] = '\0';
        auxbuf[0x37] = '\0';
        auxbuf[0x38] = '\0';
        auxbuf[0x39] = '\0';
        auxbuf[0x3a] = '\0';
        auxbuf[0x3b] = '\0';
        auxbuf[0x3c] = '\0';
        auxbuf[0x3d] = '\0';
        auxbuf[0x3e] = '\0';
        auxbuf[0x3f] = '\0';
        auxbuf[0x40] = '\0';
        auxbuf[0x41] = '\0';
        auxbuf[0x42] = '\0';
        auxbuf[0x43] = '\0';
        auxbuf[0x44] = '\0';
        auxbuf[0x45] = '\0';
        auxbuf[0x46] = '\0';
        auxbuf[0x47] = '\0';
        auxbuf[0x48] = '\0';
        auxbuf[0x49] = '\0';
        auxbuf[0x4a] = '\0';
        auxbuf[0x4b] = '\0';
        auxbuf[0x4c] = '\0';
        auxbuf[0x4d] = '\0';
        auxbuf[0x4e] = '\0';
        auxbuf[0x4f] = '\0';
        auxbuf[0x50] = '\0';
        auxbuf[0x51] = '\0';
        auxbuf[0x52] = '\0';
        auxbuf[0x53] = '\0';
        auxbuf[0x54] = '\0';
        auxbuf[0x55] = '\0';
        auxbuf[0x56] = '\0';
        auxbuf[0x57] = '\0';
        auxbuf[0x58] = '\0';
        auxbuf[0x59] = '\0';
        auxbuf[0x5a] = '\0';
        auxbuf[0x5b] = '\0';
        auxbuf[0x5c] = '\0';
        auxbuf[0x5d] = '\0';
        auxbuf[0x5e] = '\0';
        auxbuf[0x5f] = '\0';
        auxbuf[0x60] = '\0';
        auxbuf[0x61] = '\0';
        auxbuf[0x62] = '\0';
        auxbuf[99] = '\0';
        auxbuf[100] = '\0';
        auxbuf[0x65] = '\0';
        auxbuf[0x66] = '\0';
        auxbuf[0x67] = '\0';
        auxbuf[0x68] = '\0';
        auxbuf[0x69] = '\0';
        auxbuf[0x6a] = '\0';
        auxbuf[0x6b] = '\0';
        auxbuf[0x6c] = '\0';
        auxbuf[0x6d] = '\0';
        auxbuf[0x6e] = '\0';
        auxbuf[0x6f] = '\0';
        auxbuf[0x70] = '\0';
        auxbuf[0x71] = '\0';
        auxbuf[0x72] = '\0';
        auxbuf[0x73] = '\0';
        auxbuf[0x74] = '\0';
        auxbuf[0x75] = '\0';
        auxbuf[0x76] = '\0';
        auxbuf[0x77] = '\0';
        auxbuf[0x78] = '\0';
        auxbuf[0x79] = '\0';
        auxbuf[0x7a] = '\0';
        auxbuf[0x7b] = '\0';
        auxbuf[0x7c] = '\0';
        auxbuf[0x7d] = '\0';
        auxbuf[0x7e] = '\0';
        auxbuf[0x7f] = '\0';
        local_1184 = 0;
        pthread_mutex_lock((pthread_mutex_t *)&SeanetConnectingCS);
        AdLow = seanet.ADLow;
        AdSpan = seanet.ADSpan;
        Steps = seanet.Resolution;
        NSteps = seanet.NSteps;
        Hdctrl = seanet.HdCtrl;
        StepAngleSize = seanet.StepAngleSize;
        NBins = seanet.NBins;
        alpha_max_err = seanet.alpha_max_err;
        d_max_err = seanet.d_max_err;
        rangescale = seanet.RangeScale;
        index_scanlines_prev = 0;
        index_scanlines = 0;
        free(tvs);
        free(angles);
        free(scanlines);
        sVar10 = (size_t)seanet.NSteps;
        tvs = (timeval *)calloc(sVar10,0x10);
        local_1178 = tvs;
        pdVar6 = (double *)calloc(sVar10,8);
        angles = pdVar6;
        scanlines = (uchar *)calloc(sVar10 << 0xb,1);
        if (((local_1178 == (timeval *)0x0) || (pdVar6 == (double *)0x0)) ||
           (scanlines == (uchar *)0x0)) {
          puts("Unable to allocate Seanet data.");
          pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
          bVar4 = false;
          break;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
        if (seanet.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)seanet.pfSaveFile);
          seanet.pfSaveFile = (FILE *)0x0;
        }
        if (seanet.bSaveRawData != 0) {
          if (seanet.szCfgFilePath[0] == '\0') {
            builtin_strncpy(szTemp,"seanet",7);
          }
          else {
            sprintf(szTemp,"%.127s",seanet.szCfgFilePath);
          }
          sVar10 = strlen(szTemp);
          iVar5 = (int)sVar10 + 1;
          uVar9 = sVar10 & 0xffffffff;
          do {
            if ((int)uVar9 < 1) goto LAB_00171576;
            uVar1 = uVar9 - 1;
            iVar5 = iVar5 + -1;
            lVar11 = uVar9 - 1;
            uVar9 = uVar1;
          } while (szTemp[lVar11] != '.');
          if ((uVar1 != 0) && (iVar5 <= (int)sVar10)) {
            memset(szTemp + (uVar1 & 0xffffffff),0,sVar10 - (uVar1 & 0xffffffff));
          }
LAB_00171576:
          pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
          pcVar7 = strtimeex_fns();
          sprintf(szSaveFilePath,"log/%.127s_%.64s.csv",szTemp,pcVar7);
          pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
          seanet.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
          if ((FILE *)seanet.pfSaveFile == (FILE *)0x0) {
            puts("Unable to create Seanet data file.");
            bVar4 = false;
            break;
          }
          fwrite("SOf,DateTime,Node,Status,Hdctrl,Rangescale,Gain,Slope,AdLow,AdSpan,LeftLim,RightLim,Steps,Bearing,Dbytes,Dbytes of DATA\n"
                 ,0x78,1,(FILE *)seanet.pfSaveFile);
          fflush((FILE *)seanet.pfSaveFile);
        }
        bVar4 = false;
        bVar3 = true;
      }
      else {
LAB_0017122d:
        mSleep(lVar11);
        local_116c = local_116c + 1;
        if (ExitOnErrorCount <= local_116c && 0 < ExitOnErrorCount) {
          bExit = 1;
LAB_0017197d:
          bVar4 = true;
          break;
        }
        bVar3 = false;
        bVar4 = true;
      }
    }
  } while (bExit == 0);
  StopChronoQuick(&chrono_period);
  if (seanet.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)seanet.pfSaveFile);
    seanet.pfSaveFile = (FILE *)0x0;
  }
  pthread_mutex_lock((pthread_mutex_t *)&SeanetConnectingCS);
  free(scanlines);
  scanlines = (uchar *)0x0;
  free(angles);
  angles = (double *)0x0;
  free(tvs);
  tvs = (timeval *)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
  if (!bVar4) {
    DisconnectSeanetEx(&seanet);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SeanetThread(void* pParam)
{
	SEANET seanet;
	//SEANETDATA seanetdata;
	struct timeval tv;
	double angle = 0;
	unsigned char scanline[MAX_NB_BYTES_SEANET];
	unsigned char auxbuf[128]; // For daisy-chained device.
	int nbauxbytes = 0; // For daisy-chained device.
	double distance = 0; // For daisy-chained echosounder.
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&seanet, 0, sizeof(SEANET));

	memset(&tv, 0, sizeof(tv));
	angle = 0;
	memset(scanline, 0, sizeof(scanline));
	memset(auxbuf, 0, sizeof(auxbuf));
	nbauxbytes = 0;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseSeanet) 
		{
			if (bConnected)
			{
				printf("Seanet paused.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSeanet) 
		{
			if (bConnected)
			{
				printf("Restarting a Seanet.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
			}
			bRestartSeanet = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSeanetEx(&seanet, "Seanet0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = seanet.threadperiod;

				memset(&tv, 0, sizeof(tv));
				angle = 0;
				memset(scanline, 0, sizeof(scanline));
				memset(auxbuf, 0, sizeof(auxbuf));
				nbauxbytes = 0;

				EnterCriticalSection(&SeanetConnectingCS);

				AdLow = seanet.ADLow;
				AdSpan = seanet.ADSpan;
				Steps = seanet.Resolution;
				NSteps = seanet.NSteps;
				Hdctrl = seanet.HdCtrl;
				StepAngleSize = seanet.StepAngleSize;
				NBins = seanet.NBins;

				alpha_max_err = seanet.alpha_max_err;
				d_max_err = seanet.d_max_err;
				rangescale = seanet.RangeScale;

				index_scanlines_prev = 0;
				index_scanlines = 0;

				free(tvs); free(angles); free(scanlines);
				tvs = NULL; angles = NULL; scanlines = NULL;
				tvs = (struct timeval*)calloc(seanet.NSteps, sizeof(struct timeval));
				angles = (double*)calloc(seanet.NSteps, sizeof(double));
				scanlines = (unsigned char*)calloc(seanet.NSteps*MAX_NB_BYTES_SEANET, sizeof(unsigned char));
				if ((tvs == NULL)||(angles == NULL)||(scanlines == NULL))
				{
					printf("Unable to allocate Seanet data.\n");
					LeaveCriticalSection(&SeanetConnectingCS);
					break;
				}

				LeaveCriticalSection(&SeanetConnectingCS);

				if (seanet.pfSaveFile != NULL)
				{
					fclose(seanet.pfSaveFile); 
					seanet.pfSaveFile = NULL;
				}
				if ((seanet.bSaveRawData)&&(seanet.pfSaveFile == NULL)) 
				{
					if (strlen(seanet.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", seanet.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "seanet");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					seanet.pfSaveFile = fopen(szSaveFilePath, "w");
					if (seanet.pfSaveFile == NULL) 
					{
						printf("Unable to create Seanet data file.\n");
						break;
					}
					fprintf(seanet.pfSaveFile, 
						"SOf,DateTime,Node,Status,Hdctrl,Rangescale,Gain,Slope,AdLow,AdSpan,LeftLim,RightLim,Steps,Bearing,Dbytes,Dbytes of DATA\n"
						); 
					fflush(seanet.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			nbauxbytes = 0;
			// Swap commented line to enable/disable Aux device support...
			//if (GetHeadDataSeanetEx(&seanet, scanline, &angle) == EXIT_SUCCESS)
			if (GetHeadDataAndAuxDataSeanetEx(&seanet, scanline, &angle, auxbuf, &nbauxbytes) == EXIT_SUCCESS)
			{
				time_t tt = 0;
				struct tm* timeptr = NULL;
				int Hour = 0, Min = 0;
				double Seconds = 0;

				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				tt = tv.tv_sec;
				timeptr = localtime(&tt);
				if (timeptr != NULL)
				{
					Hour = timeptr->tm_hour;
					Min = timeptr->tm_min;
					Seconds = timeptr->tm_sec+0.000001*tv.tv_usec;
				}

				if (nbauxbytes > 0)
				{
					// Echosounder.
					if (sscanf((char*)auxbuf, "%lfm\r", &distance) == 1)
					{
						EnterCriticalSection(&StateVariablesCS);

						altitude_AGL = distance;

						LeaveCriticalSection(&StateVariablesCS);
					}

					if (seanet.bSaveRawData)
					{
						// Should remove the final LF from auxbuf (maybe in HeadDataReplyAndAuxDataSeanet()...) 
						// and end-of-line characters might be inconsistent with Seanet log files (especially on Linux)... 

						fprintf(seanet.pfSaveFile, "%02d:%02d:%06.3f,%.100s\n", Hour, Min, Seconds, (char*)auxbuf);
					}
				}

				EnterCriticalSection(&SeanetDataCS);

				tvs[index_scanlines] = tv;
				angles[index_scanlines] = angle;
				memcpy(scanlines+index_scanlines*seanet.NBins, scanline, seanet.NBins);
				index_scanlines++;
				index_scanlines = index_scanlines%seanet.NSteps;

				//// For direct waterfall display...
				//memmove(tvs+1, tvs, (seanet.NSteps-1)*sizeof(struct timeval));
				//tvs[0] = tv;
				//memmove(angles+1, angles, (seanet.NSteps-1)*sizeof(double));
				//angles[0] = angle;
				//memmove(scanlines+seanet.NBins, scanlines, (seanet.NSteps-1)*seanet.NBins);
				//memcpy(scanlines, scanline, seanet.NBins);

				LeaveCriticalSection(&SeanetDataCS);

				if (seanet.bSaveRawData)
				{
					char SOf[3+1];
					int Bearing = 0;

					if (seanet.bDST) strcpy(SOf, "DIG"); else strcpy(SOf, "SON");

					Bearing = ((int)(angle/0.05625+3200+6400))%6400; // Angle of the transducer (0..6399 in 1/16 Gradian units, 0.05625 = (1/16)*(9/10)).

					fprintf(seanet.pfSaveFile, "%.3s,%02d:%02d:%06.3f,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d", 
						SOf, Hour, Min, Seconds, SERIAL_PORT_SONAR_NODE_NUMBER_SEANET, 
						seanet.HeadStatus, seanet.HeadHdCtrl.i, seanet.HeadRangescale, seanet.HeadIGain, 
						seanet.HeadSlope, seanet.HeadADLow, seanet.HeadADSpan, seanet.HeadLeftLim, seanet.HeadRightLim, 
						seanet.HeadSteps, Bearing, seanet.Dbytes
						);

					// We should take into account ADLow and ADSpan here?

					if (!seanet.adc8on)	
					{ 
						for (i = 0; i < seanet.Dbytes; i++)
						{
							int byte = ((scanline[2*i]/16)<<4)+scanline[2*i+1]/16;
							fprintf(seanet.pfSaveFile, ",%d", byte);
						}
					}
					else
					{ 
						for (i = 0; i < seanet.Dbytes; i++)
						{
							fprintf(seanet.pfSaveFile, ",%d", (int)scanline[i]);
						}
					}

					fprintf(seanet.pfSaveFile, "\n");

					fflush(seanet.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a Seanet lost.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
				mSleep(threadperiod);
			}
		}

		//printf("SeanetThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (seanet.pfSaveFile != NULL)
	{
		fclose(seanet.pfSaveFile); 
		seanet.pfSaveFile = NULL;
	}

	EnterCriticalSection(&SeanetConnectingCS);
	free(scanlines);
	scanlines = NULL;
	free(angles);
	angles = NULL;
	free(tvs);
	tvs = NULL;
	LeaveCriticalSection(&SeanetConnectingCS);

	if (bConnected) DisconnectSeanetEx(&seanet);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}